

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void randomize(int *indices,int count)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)count;
  while( true ) {
    uVar4 = uVar5 - 1;
    if ((int)uVar5 < 2) break;
    uVar2 = rn2((int)uVar5);
    uVar3 = (ulong)uVar2;
    uVar5 = uVar4;
    if (uVar4 != uVar3) {
      iVar1 = indices[uVar4];
      indices[uVar4] = indices[uVar3];
      indices[uVar3] = iVar1;
    }
  }
  return;
}

Assistant:

static void randomize(int *indices, int count)
{
	int i, iswap, temp;

	for (i = count - 1; i > 0; i--) {
	    if ((iswap = rn2(i + 1)) == i) continue;
	    temp = indices[i];
	    indices[i] = indices[iswap];
	    indices[iswap] = temp;
	}
}